

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O3

wchar_t project_player_handler_NEXUS(project_player_handler_context_t *context)

{
  anon_enum_32 aVar1;
  player_state_conflict state;
  player *p;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  monster *pmVar5;
  long lVar6;
  anon_union_8_5_62f3dbed_for_which aVar7;
  player_state_conflict *ppVar8;
  undefined8 *puVar9;
  char *pcVar10;
  wchar_t subtype;
  byte bVar11;
  source origin;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined1 in_stack_fffffffffffffe98 [280];
  undefined4 uVar30;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  wchar_t y;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  wchar_t x;
  undefined4 in_stack_ffffffffffffffcc;
  
  bVar11 = 0;
  if ((context->origin).what == SRC_MONSTER) {
    pmVar5 = cave_monster(cave,(context->origin).which.grid.x);
  }
  else {
    pmVar5 = (monster *)0x0;
  }
  ppVar8 = &player->state;
  puVar9 = (undefined8 *)&stack0xfffffffffffffe98;
  for (lVar6 = 0x27; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar9 = *(undefined8 *)ppVar8->stat_add;
    ppVar8 = (player_state_conflict *)((long)ppVar8 + (ulong)bVar11 * -0x10 + 8);
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
  }
  uVar30 = (undefined4)((ulong)in_stack_ffffffffffffffb0 >> 0x10);
  state.el_info[0x13].flags = (char)in_stack_ffffffffffffffb0;
  state.el_info[0x13]._3_1_ = (char)((ulong)in_stack_ffffffffffffffb0 >> 8);
  state.el_info[0x14].res_level = (short)uVar30;
  state.el_info[0x14].flags = (char)((uint)uVar30 >> 0x10);
  state.el_info[0x14]._3_1_ = (char)((uint)uVar30 >> 0x18);
  state.el_info[0x15].res_level = (short)((ulong)in_stack_ffffffffffffffb0 >> 0x30);
  uVar30 = in_stack_fffffffffffffe98._202_4_;
  uVar12 = in_stack_fffffffffffffe98._206_4_;
  uVar13 = in_stack_fffffffffffffe98._210_4_;
  uVar14 = in_stack_fffffffffffffe98._214_4_;
  uVar15 = in_stack_fffffffffffffe98._218_4_;
  uVar16 = in_stack_fffffffffffffe98._222_4_;
  uVar17 = in_stack_fffffffffffffe98._226_4_;
  uVar18 = in_stack_fffffffffffffe98._230_4_;
  uVar19 = in_stack_fffffffffffffe98._234_4_;
  uVar20 = in_stack_fffffffffffffe98._238_4_;
  uVar21 = in_stack_fffffffffffffe98._242_4_;
  uVar22 = in_stack_fffffffffffffe98._246_4_;
  uVar23 = in_stack_fffffffffffffe98._250_4_;
  uVar24 = in_stack_fffffffffffffe98._254_4_;
  uVar25 = in_stack_fffffffffffffe98._258_4_;
  uVar26 = in_stack_fffffffffffffe98._262_4_;
  uVar27 = in_stack_fffffffffffffe98._266_4_;
  uVar28 = in_stack_fffffffffffffe98._270_4_;
  uVar29 = in_stack_fffffffffffffe98._274_4_;
  state.stat_add[0] = in_stack_fffffffffffffe98._0_4_;
  state.stat_add[1] = in_stack_fffffffffffffe98._4_4_;
  state.stat_add[2] = in_stack_fffffffffffffe98._8_4_;
  state.stat_add[3] = in_stack_fffffffffffffe98._12_4_;
  state.stat_add[4] = in_stack_fffffffffffffe98._16_4_;
  state.stat_ind[0] = in_stack_fffffffffffffe98._20_4_;
  state.stat_ind[1] = in_stack_fffffffffffffe98._24_4_;
  state.stat_ind[2] = in_stack_fffffffffffffe98._28_4_;
  state.stat_ind[3] = in_stack_fffffffffffffe98._32_4_;
  state.stat_ind[4] = in_stack_fffffffffffffe98._36_4_;
  state.stat_use[0] = in_stack_fffffffffffffe98._40_4_;
  state.stat_use[1] = in_stack_fffffffffffffe98._44_4_;
  state.stat_use[2] = in_stack_fffffffffffffe98._48_4_;
  state.stat_use[3] = in_stack_fffffffffffffe98._52_4_;
  state.stat_use[4] = in_stack_fffffffffffffe98._56_4_;
  state.stat_top[0] = in_stack_fffffffffffffe98._60_4_;
  state.stat_top[1] = in_stack_fffffffffffffe98._64_4_;
  state.stat_top[2] = in_stack_fffffffffffffe98._68_4_;
  state.stat_top[3] = in_stack_fffffffffffffe98._72_4_;
  state.stat_top[4] = in_stack_fffffffffffffe98._76_4_;
  state.skills[0] = in_stack_fffffffffffffe98._80_4_;
  state.skills[1] = in_stack_fffffffffffffe98._84_4_;
  state.skills[2] = in_stack_fffffffffffffe98._88_4_;
  state.skills[3] = in_stack_fffffffffffffe98._92_4_;
  state.skills[4] = in_stack_fffffffffffffe98._96_4_;
  state.skills[5] = in_stack_fffffffffffffe98._100_4_;
  state.skills[6] = in_stack_fffffffffffffe98._104_4_;
  state.skills[7] = in_stack_fffffffffffffe98._108_4_;
  state.skills[8] = in_stack_fffffffffffffe98._112_4_;
  state.skills[9] = in_stack_fffffffffffffe98._116_4_;
  state.speed = in_stack_fffffffffffffe98._120_4_;
  state.num_blows = in_stack_fffffffffffffe98._124_4_;
  state.num_shots = in_stack_fffffffffffffe98._128_4_;
  state.num_moves = in_stack_fffffffffffffe98._132_4_;
  state.ammo_mult = in_stack_fffffffffffffe98._136_4_;
  state.ammo_tval = in_stack_fffffffffffffe98._140_4_;
  state.ac = in_stack_fffffffffffffe98._144_4_;
  state.dam_red = in_stack_fffffffffffffe98._148_4_;
  state.perc_dam_red = in_stack_fffffffffffffe98._152_4_;
  state.to_a = in_stack_fffffffffffffe98._156_4_;
  state.to_h = in_stack_fffffffffffffe98._160_4_;
  state.to_d = in_stack_fffffffffffffe98._164_4_;
  state.see_infra = in_stack_fffffffffffffe98._168_4_;
  state.cur_light = in_stack_fffffffffffffe98._172_4_;
  state.evasion_chance = in_stack_fffffffffffffe98._176_4_;
  state.shield_on_back = (_Bool)in_stack_fffffffffffffe98[0xb4];
  state.heavy_wield = (_Bool)in_stack_fffffffffffffe98[0xb5];
  state.heavy_shoot = (_Bool)in_stack_fffffffffffffe98[0xb6];
  state.bless_wield = (_Bool)in_stack_fffffffffffffe98[0xb7];
  state.cumber_armor = (_Bool)in_stack_fffffffffffffe98[0xb8];
  state.flags[0] = in_stack_fffffffffffffe98[0xb9];
  state.flags[1] = in_stack_fffffffffffffe98[0xba];
  state.flags[2] = in_stack_fffffffffffffe98[0xbb];
  state.flags[3] = in_stack_fffffffffffffe98[0xbc];
  state.flags[4] = in_stack_fffffffffffffe98[0xbd];
  state.flags[5] = in_stack_fffffffffffffe98[0xbe];
  state.pflags[0] = in_stack_fffffffffffffe98[0xbf];
  state.pflags[1] = in_stack_fffffffffffffe98[0xc0];
  state.pflags[2] = in_stack_fffffffffffffe98[0xc1];
  state.pflags[3] = in_stack_fffffffffffffe98[0xc2];
  state.pflags[4] = in_stack_fffffffffffffe98[0xc3];
  state.pflags[5] = in_stack_fffffffffffffe98[0xc4];
  state.pflags[6] = in_stack_fffffffffffffe98[0xc5];
  state.pflags[7] = in_stack_fffffffffffffe98[0xc6];
  state.pflags[8] = in_stack_fffffffffffffe98[199];
  state.pflags[9] = in_stack_fffffffffffffe98[200];
  state._201_1_ = in_stack_fffffffffffffe98[0xc9];
  state.el_info[0].res_level = (short)uVar30;
  state.el_info[0].flags = (char)((uint)uVar30 >> 0x10);
  state.el_info[0]._3_1_ = (char)((uint)uVar30 >> 0x18);
  state.el_info[1].res_level = (short)uVar12;
  state.el_info[1].flags = (char)((uint)uVar12 >> 0x10);
  state.el_info[1]._3_1_ = (char)((uint)uVar12 >> 0x18);
  state.el_info[2].res_level = (short)uVar13;
  state.el_info[2].flags = (char)((uint)uVar13 >> 0x10);
  state.el_info[2]._3_1_ = (char)((uint)uVar13 >> 0x18);
  state.el_info[3].res_level = (short)uVar14;
  state.el_info[3].flags = (char)((uint)uVar14 >> 0x10);
  state.el_info[3]._3_1_ = (char)((uint)uVar14 >> 0x18);
  state.el_info[4].res_level = (short)uVar15;
  state.el_info[4].flags = (char)((uint)uVar15 >> 0x10);
  state.el_info[4]._3_1_ = (char)((uint)uVar15 >> 0x18);
  state.el_info[5].res_level = (short)uVar16;
  state.el_info[5].flags = (char)((uint)uVar16 >> 0x10);
  state.el_info[5]._3_1_ = (char)((uint)uVar16 >> 0x18);
  state.el_info[6].res_level = (short)uVar17;
  state.el_info[6].flags = (char)((uint)uVar17 >> 0x10);
  state.el_info[6]._3_1_ = (char)((uint)uVar17 >> 0x18);
  state.el_info[7].res_level = (short)uVar18;
  state.el_info[7].flags = (char)((uint)uVar18 >> 0x10);
  state.el_info[7]._3_1_ = (char)((uint)uVar18 >> 0x18);
  state.el_info[8].res_level = (short)uVar19;
  state.el_info[8].flags = (char)((uint)uVar19 >> 0x10);
  state.el_info[8]._3_1_ = (char)((uint)uVar19 >> 0x18);
  state.el_info[9].res_level = (short)uVar20;
  state.el_info[9].flags = (char)((uint)uVar20 >> 0x10);
  state.el_info[9]._3_1_ = (char)((uint)uVar20 >> 0x18);
  state.el_info[10].res_level = (short)uVar21;
  state.el_info[10].flags = (char)((uint)uVar21 >> 0x10);
  state.el_info[10]._3_1_ = (char)((uint)uVar21 >> 0x18);
  state.el_info[0xb].res_level = (short)uVar22;
  state.el_info[0xb].flags = (char)((uint)uVar22 >> 0x10);
  state.el_info[0xb]._3_1_ = (char)((uint)uVar22 >> 0x18);
  state.el_info[0xc].res_level = (short)uVar23;
  state.el_info[0xc].flags = (char)((uint)uVar23 >> 0x10);
  state.el_info[0xc]._3_1_ = (char)((uint)uVar23 >> 0x18);
  state.el_info[0xd].res_level = (short)uVar24;
  state.el_info[0xd].flags = (char)((uint)uVar24 >> 0x10);
  state.el_info[0xd]._3_1_ = (char)((uint)uVar24 >> 0x18);
  state.el_info[0xe].res_level = (short)uVar25;
  state.el_info[0xe].flags = (char)((uint)uVar25 >> 0x10);
  state.el_info[0xe]._3_1_ = (char)((uint)uVar25 >> 0x18);
  state.el_info[0xf].res_level = (short)uVar26;
  state.el_info[0xf].flags = (char)((uint)uVar26 >> 0x10);
  state.el_info[0xf]._3_1_ = (char)((uint)uVar26 >> 0x18);
  state.el_info[0x10].res_level = (short)uVar27;
  state.el_info[0x10].flags = (char)((uint)uVar27 >> 0x10);
  state.el_info[0x10]._3_1_ = (char)((uint)uVar27 >> 0x18);
  state.el_info[0x11].res_level = (short)uVar28;
  state.el_info[0x11].flags = (char)((uint)uVar28 >> 0x10);
  state.el_info[0x11]._3_1_ = (char)((uint)uVar28 >> 0x18);
  state.el_info[0x12].res_level = (short)uVar29;
  state.el_info[0x12].flags = (char)((uint)uVar29 >> 0x10);
  state.el_info[0x12]._3_1_ = (char)((uint)uVar29 >> 0x18);
  state.el_info[0x13].res_level = in_stack_fffffffffffffe98._278_2_;
  state.el_info[0x15].flags = (char)in_stack_ffffffffffffffb8;
  state.el_info[0x15]._3_1_ = (char)((uint)in_stack_ffffffffffffffb8 >> 8);
  state.el_info[0x16].res_level = (short)((uint)in_stack_ffffffffffffffb8 >> 0x10);
  state.el_info[0x16].flags = (char)in_stack_ffffffffffffffbc;
  state.el_info[0x16]._3_1_ = (char)((uint)in_stack_ffffffffffffffbc >> 8);
  state.el_info[0x17].res_level = (short)((uint)in_stack_ffffffffffffffbc >> 0x10);
  state.el_info[0x17].flags = (char)in_stack_ffffffffffffffc0;
  state.el_info[0x17]._3_1_ = (char)((uint)in_stack_ffffffffffffffc0 >> 8);
  state.el_info[0x18].res_level = (short)((uint)in_stack_ffffffffffffffc0 >> 0x10);
  state.el_info[0x18].flags = (char)in_stack_ffffffffffffffc4;
  state.el_info[0x18]._3_1_ = (char)((uint)in_stack_ffffffffffffffc4 >> 8);
  state.el_info[0x19].res_level = (short)((uint)in_stack_ffffffffffffffc4 >> 0x10);
  state.el_info[0x19].flags = (char)in_stack_ffffffffffffffc8;
  state.el_info[0x19]._3_1_ = (char)((uint)in_stack_ffffffffffffffc8 >> 8);
  state.el_info[0x1a].res_level = (short)((uint)in_stack_ffffffffffffffc8 >> 0x10);
  state.el_info[0x1a].flags = (char)in_stack_ffffffffffffffcc;
  state.el_info[0x1a]._3_1_ = (char)((uint)in_stack_ffffffffffffffcc >> 8);
  state.el_info[0x1b].res_level = (short)((uint)in_stack_ffffffffffffffcc >> 0x10);
  state._312_4_ = *(undefined4 *)&(player->state).el_info[0x1b].flags;
  _Var2 = player_resists_effects(state,L'\t');
  if (_Var2) {
    pcVar10 = "You resist the effect!";
LAB_001c884f:
    msg(pcVar10);
  }
  else {
    wVar3 = Rand_div(100);
    p = player;
    if (wVar3 < (player->state).skills[3]) {
      msg("You avoid the effect!");
    }
    else {
      uVar4 = Rand_div(0x14);
      player_inc_timed(p,L'\x1f',uVar4 + L'\x14',true,true,true);
    }
    uVar4 = Rand_div(3);
    if (pmVar5 == (monster *)0x0 || uVar4 != 0) {
      uVar4 = Rand_div(4);
      if (uVar4 == 0) {
        wVar3 = Rand_div(100);
        if (wVar3 < (player->state).skills[3]) {
          pcVar10 = "You avoid the effect!";
          goto LAB_001c884f;
        }
        aVar1 = (context->origin).what;
        aVar7 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
        pcVar10 = "0";
        wVar3 = L'=';
        subtype = L'\0';
      }
      else {
        aVar1 = (context->origin).what;
        aVar7 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
        pcVar10 = "200";
        wVar3 = L';';
        subtype = L'\x01';
      }
      x = L'\0';
      y = L'\0';
    }
    else {
      x = (pmVar5->grid).x;
      y = (pmVar5->grid).y;
      aVar1 = (context->origin).what;
      aVar7 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
      pcVar10 = "0";
      wVar3 = L'<';
      subtype = L'\0';
    }
    origin._4_4_ = 0;
    origin.what = aVar1;
    origin.which.trap = aVar7.trap;
    effect_simple(wVar3,origin,pcVar10,subtype,L'\0',L'\0',y,x,(_Bool *)0x0);
  }
  return L'\0';
}

Assistant:

static int project_player_handler_NEXUS(project_player_handler_context_t *context)
{
	struct monster *mon = NULL;
	if (context->origin.what == SRC_MONSTER) {
		mon = cave_monster(cave, context->origin.which.monster);
	}

	if (player_resists_effects(player->state, ELEM_NEXUS)) {
		msg("You resist the effect!");
		return 0;
	}

	/* Stat swap */
	if (randint0(100) < player->state.skills[SKILL_SAVE]) {
		msg("You avoid the effect!");
	} else {
		player_inc_timed(player, TMD_SCRAMBLE, randint0(20) + 20, true,
			true, true);
	}

	if (one_in_(3) && mon) { /* Teleport to */
		effect_simple(EF_TELEPORT_TO, context->origin, "0", 0, 0, 0,
					  mon->grid.y, mon->grid.x, NULL);
	} else if (one_in_(4)) { /* Teleport level */
		if (randint0(100) < player->state.skills[SKILL_SAVE]) {
			msg("You avoid the effect!");
			return 0;
		}
		effect_simple(EF_TELEPORT_LEVEL, context->origin, "0", 0, 0, 0, 0, 0,
					  NULL);
	} else { /* Teleport */
		const char *miles = "200";
		effect_simple(EF_TELEPORT, context->origin, miles, 1, 0, 0, 0, 0, NULL);
	}
	return 0;
}